

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.cpp
# Opt level: O2

void processUCI(void)

{
  bool bVar1;
  move mVar2;
  int iVar3;
  U64 UVar4;
  ostream *poVar5;
  string *psVar6;
  arrayMoveList *this;
  int iVar7;
  string token3;
  string input2;
  string token3_1;
  string token2;
  string token;
  string input;
  engineState state;
  string input3;
  undefined1 local_a50 [64];
  string local_a10;
  string local_9f0;
  string local_9d0;
  undefined1 local_9b0 [64];
  string local_970;
  string local_950;
  string local_930 [32];
  engineState local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  arrayMoveList local_558;
  game local_250;
  game local_140;
  
  engineState::engineState(&local_910);
  do {
    hearGUI_abi_cxx11_();
    std::__cxx11::string::string((string *)&local_578,local_930);
    getFirstToken(&local_950,&local_578);
    std::__cxx11::string::~string((string *)&local_578);
    bVar1 = std::operator==(&local_950,"uci");
    if (bVar1) {
      local_910.isUCI = true;
      std::__cxx11::string::string((string *)&local_598,"id name Valley",(allocator *)&local_558);
      tellGUI(&local_598);
      std::__cxx11::string::~string((string *)&local_598);
      std::__cxx11::string::string
                ((string *)&local_5b8,"id author Tyler Behme",(allocator *)&local_558);
      tellGUI(&local_5b8);
      std::__cxx11::string::~string((string *)&local_5b8);
      psVar6 = &local_5d8;
      std::__cxx11::string::string((string *)psVar6,"uciok",(allocator *)&local_558);
      tellGUI(psVar6);
LAB_00105727:
      std::__cxx11::string::~string((string *)psVar6);
    }
    else {
      bVar1 = std::operator==(&local_950,"isready");
      if (bVar1) {
        psVar6 = &local_5f8;
        std::__cxx11::string::string((string *)psVar6,"readyok",(allocator *)&local_558);
        tellGUI(psVar6);
        goto LAB_00105727;
      }
      bVar1 = std::operator==(&local_950,"debug");
      if (((!bVar1) && (bVar1 = std::operator==(&local_950,"setoption"), !bVar1)) &&
         (bVar1 = std::operator==(&local_950,"register"), !bVar1)) {
        bVar1 = std::operator==(&local_950,"ucinewgame");
        if (bVar1) {
          game::game((game *)&local_558);
          game::operator=(&local_910.Game,(game *)&local_558);
          game::~game((game *)&local_558);
          local_910.inGame = true;
        }
        else {
          bVar1 = std::operator==(&local_950,"position");
          if (bVar1) {
            game::game((game *)&local_558);
            game::operator=(&local_910.Game,(game *)&local_558);
            game::~game((game *)&local_558);
            local_910.inGame = true;
            std::__cxx11::string::string((string *)&local_618,local_930);
            removeFirstToken((string *)(local_a50 + 0x20),&local_618);
            std::__cxx11::string::~string((string *)&local_618);
            std::__cxx11::string::string((string *)&local_638,(string *)(local_a50 + 0x20));
            getFirstToken(&local_9f0,&local_638);
            std::__cxx11::string::~string((string *)&local_638);
            bVar1 = std::operator==(&local_9f0,"startpos");
            if (bVar1) {
              std::__cxx11::string::string((string *)&local_658,(string *)(local_a50 + 0x20));
              removeFirstToken((string *)&local_558,&local_658);
              std::__cxx11::string::~string((string *)&local_658);
              std::__cxx11::string::string((string *)&local_678,(string *)&local_558);
              psVar6 = (string *)local_a50;
              getFirstToken(psVar6,&local_678);
              std::__cxx11::string::~string((string *)&local_678);
              bVar1 = std::operator==(psVar6,"moves");
              if (bVar1) {
                std::__cxx11::string::string((string *)&local_970,(string *)&local_558);
                removeFirstToken(&local_698,&local_970);
                parseMovesIntoGame(&local_910.Game,&local_698);
                std::__cxx11::string::~string((string *)&local_698);
                std::__cxx11::string::~string((string *)&local_970);
                psVar6 = (string *)local_a50;
              }
LAB_00105d8c:
              std::__cxx11::string::~string((string *)psVar6);
              this = &local_558;
LAB_00105ea4:
              std::__cxx11::string::~string((string *)this);
            }
            else {
              bVar1 = std::operator==(&local_9f0,"fen");
              if (bVar1) {
                std::__cxx11::string::string((string *)&local_6b8,(string *)(local_a50 + 0x20));
                removeFirstToken((string *)local_a50,&local_6b8);
                std::__cxx11::string::~string((string *)&local_6b8);
                std::__cxx11::string::string((string *)&local_6d8,(string *)local_a50);
                getFirstToken(&local_a10,&local_6d8);
                std::__cxx11::string::~string((string *)&local_6d8);
                FENtoGame((game *)&local_558,
                          (char *)CONCAT53(local_a50._3_5_,CONCAT12(local_a50[2],local_a50._0_2_)));
                game::operator=(&local_910.Game,(game *)&local_558);
                game::~game((game *)&local_558);
                std::__cxx11::string::string((string *)&local_558,(string *)local_a50);
                while( true ) {
                  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&local_558,"");
                  if (!bVar1) break;
                  std::__cxx11::string::string((string *)&local_6f8,(string *)&local_558);
                  getFirstToken(&local_9d0,&local_6f8);
                  bVar1 = std::operator==(&local_9d0,"moves");
                  std::__cxx11::string::~string((string *)&local_9d0);
                  std::__cxx11::string::~string((string *)&local_6f8);
                  if (bVar1) {
                    std::__cxx11::string::string((string *)(local_9b0 + 0x20),(string *)&local_558);
                    removeFirstToken(&local_718,(string *)(local_9b0 + 0x20));
                    parseMovesIntoGame(&local_910.Game,&local_718);
                    std::__cxx11::string::~string((string *)&local_718);
                    std::__cxx11::string::~string((string *)(local_9b0 + 0x20));
                    break;
                  }
                  std::__cxx11::string::string((string *)&local_738,(string *)&local_558);
                  removeFirstToken(&local_9d0,&local_738);
                  std::__cxx11::string::operator=((string *)&local_558,(string *)&local_9d0);
                  std::__cxx11::string::~string((string *)&local_9d0);
                  std::__cxx11::string::~string((string *)&local_738);
                }
                std::__cxx11::string::~string((string *)&local_558);
LAB_00105e95:
                std::__cxx11::string::~string((string *)&local_a10);
                this = (arrayMoveList *)local_a50;
                goto LAB_00105ea4;
              }
              bVar1 = std::operator==(&local_9f0,"moves");
              if (bVar1) {
                std::__cxx11::string::string((string *)local_9b0,(string *)(local_a50 + 0x20));
                removeFirstToken(&local_758,(string *)local_9b0);
                parseMovesIntoGame(&local_910.Game,&local_758);
                std::__cxx11::string::~string((string *)&local_758);
                this = (arrayMoveList *)local_9b0;
                goto LAB_00105ea4;
              }
            }
            std::__cxx11::string::~string((string *)&local_9f0);
            psVar6 = (string *)(local_a50 + 0x20);
            goto LAB_00105727;
          }
          bVar1 = std::operator==(&local_950,"go");
          if (bVar1) {
            if (local_910.inGame == false) {
              game::game((game *)&local_558);
              game::operator=(&local_910.Game,(game *)&local_558);
              game::~game((game *)&local_558);
              local_910.inGame = true;
            }
            std::__cxx11::string::string((string *)&local_778,local_930);
            removeFirstToken((string *)(local_a50 + 0x20),&local_778);
            std::__cxx11::string::~string((string *)&local_778);
            std::__cxx11::string::string((string *)&local_798,(string *)(local_a50 + 0x20));
            getFirstToken(&local_9f0,&local_798);
            std::__cxx11::string::~string((string *)&local_798);
            bVar1 = std::operator==(&local_9f0,"perft");
            if (bVar1) {
              std::__cxx11::string::string((string *)&local_7b8,(string *)(local_a50 + 0x20));
              removeFirstToken((string *)local_a50,&local_7b8);
              std::__cxx11::string::~string((string *)&local_7b8);
              std::__cxx11::string::string((string *)&local_7d8,(string *)local_a50);
              getFirstToken(&local_a10,&local_7d8);
              std::__cxx11::string::~string((string *)&local_7d8);
              iVar3 = atoi(local_a10._M_dataplus._M_p);
              game::generateLegalMoves(&local_558,&local_910.Game);
              arrayMoveList::resetIterator(&local_558);
              iVar7 = 0;
              while (bVar1 = arrayMoveList::next(&local_558), bVar1) {
                mVar2 = arrayMoveList::getMove(&local_558);
                game::makeMove(&local_910.Game,mVar2);
                game::game(&local_250,&local_910.Game);
                UVar4 = Perft(iVar3 + -1,&local_250);
                game::~game(&local_250);
                mVar2 = arrayMoveList::getMove(&local_558);
                moveToAlgebraic_abi_cxx11_(&local_9d0,mVar2);
                poVar5 = std::operator<<((ostream *)&std::cout,(string *)&local_9d0);
                poVar5 = std::operator<<(poVar5,": ");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)UVar4);
                std::endl<char,std::char_traits<char>>(poVar5);
                iVar7 = iVar7 + (int)UVar4;
                std::__cxx11::string::~string((string *)&local_9d0);
                game::undoMove(&local_910.Game);
              }
              poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              poVar5 = std::operator<<(poVar5,"Nodes searched: ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
              std::endl<char,std::char_traits<char>>(poVar5);
              goto LAB_00105e95;
            }
            local_a50[0] = '\0';
            local_a50[1] = '\0';
            local_a50[2] = '\0';
            game::game(&local_140,&local_910.Game);
            evaluate(&local_140,(move *)local_a50);
            game::~game(&local_140);
            mVar2.special = local_a50[2];
            mVar2.start = local_a50[0];
            mVar2.end = local_a50[1];
            moveToAlgebraic_abi_cxx11_((string *)&local_558,mVar2);
            psVar6 = &local_7f8;
            std::operator+(psVar6,"bestmove ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_558);
            tellGUI(psVar6);
            goto LAB_00105d8c;
          }
          bVar1 = std::operator==(&local_950,"stop");
          if (((!bVar1) && (bVar1 = std::operator==(&local_950,"ponderhit"), !bVar1)) &&
             (bVar1 = std::operator==(&local_950,"quit"), bVar1)) {
            std::__cxx11::string::~string((string *)&local_950);
            std::__cxx11::string::~string(local_930);
            game::~game(&local_910.Game);
            return;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_950);
    std::__cxx11::string::~string(local_930);
  } while( true );
}

Assistant:

void processUCI() {
  engineState state;

  while (true) {
    std::string input = hearGUI();
    std::string token = getFirstToken(input);

    if(token == "uci") {
      state.isUCI = true;
      tellGUI("id name Valley");
      tellGUI("id author Tyler Behme");
      tellGUI("uciok");
    }
    else if(token == "isready") {
      tellGUI("readyok");
    }
    else if(token == "debug") {

    }
    else if(token == "setoption") {

    }
    else if(token == "register") {

    }
    else if(token == "ucinewgame") {
      state.Game = game();
      state.inGame = true;
    }
    else if(token == "position") {
      state.Game = game();
      state.inGame = true;
      std::string input2 = removeFirstToken(input);
      std::string token2 = getFirstToken(input2);
      if(token2 == "startpos") {
        std::string input3 = removeFirstToken(input2);
        std::string token3 = getFirstToken(input3);

        if(token3 == "moves")
          parseMovesIntoGame(state.Game, removeFirstToken(input3));
      }
      else if(token2 == "fen") {
        std::string input3 = removeFirstToken(input2);
        std::string token3 = getFirstToken(input3);

        state.Game = FENtoGame(input3.c_str());

        std::string input4 = input3;
        while(input4 != "") { // Can be made safer than 'whiling' through
            if(getFirstToken(input4) == "moves") {
              parseMovesIntoGame(state.Game, removeFirstToken(input4));
              break;
            }
          input4 = removeFirstToken(input4);
        }
      }
      else if(token2 == "moves") {
        parseMovesIntoGame(state.Game, removeFirstToken(input2));
      }
    }
    else if(token == "go") {
      if(!state.inGame)
      {
        state.Game = game();
        state.inGame = true;
      }
      std::string input2 = removeFirstToken(input);
      std::string token2 = getFirstToken(input2);
      if(token2 == "perft") { // TODO: Implement checking for the depth
        std::string input3 = removeFirstToken(input2);
        std::string token3 = getFirstToken(input3);

        int depth = atoi(token3.c_str());
        int number = 0;

        arrayMoveList moves = state.Game.generateLegalMoves();
        moves.resetIterator();
        while(moves.next()) {
          state.Game.makeMove(moves.getMove());
          int subnumber = Perft(depth - 1, state.Game);
          number += subnumber;
          std::cout << moveToAlgebraic(moves.getMove()) << ": " << subnumber << std::endl;
          state.Game.undoMove();
        }
        std::cout << std::endl << "Nodes searched: " << number << std::endl;

      } else {
        move bestMove;
        evaluate(state.Game, bestMove);
        tellGUI("bestmove " + moveToAlgebraic(bestMove));
      }
    }
    else if(token == "stop") {

    }
    else if(token == "ponderhit") {

    }
    else if(token == "quit") {
      return;
    }
    else {
      // Implement checking second token later...
    }
  }
}